

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  char closeSegment;
  undefined8 in_RAX;
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  int index;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar1 = std::__cxx11::string::rfind
                    ((char *)ustring,(ulong)(keyword->_M_dataplus)._M_p,0xffffffffffffffff);
  uVar3 = ustring->_M_string_length;
  if (uVar1 + keyword->_M_string_length + 1 < uVar3) {
    pbVar2 = (byte *)((ustring->_M_dataplus)._M_p + uVar1 + keyword->_M_string_length);
    while ((((uVar3 = uVar1, *pbVar2 - 0x2a < 0x35 &&
             ((0x10000000000021U >> ((ulong)(*pbVar2 - 0x2a) & 0x3f) & 1) != 0)) &&
            (uVar3 = 0xffffffffffffffff, uVar1 != 0)) &&
           (uVar1 = std::__cxx11::string::rfind
                              ((char *)ustring,(ulong)(keyword->_M_dataplus)._M_p,uVar1 - 1),
           uVar1 != 0xffffffffffffffff))) {
      pbVar2 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + uVar1);
    }
    uVar1 = uVar3;
    uVar3 = ustring->_M_string_length;
  }
  if (uVar1 != 0xffffffffffffffff) {
    do {
      uVar3 = std::__cxx11::string::find_last_of((char *)ustring,0x17e50b,uVar3);
      if (uVar3 == 0xffffffffffffffff) {
        return uVar1;
      }
      if (uVar3 < uVar1) {
        return uVar1;
      }
      closeSegment = getMatchCharacter((ustring->_M_dataplus)._M_p[uVar3]);
      uStack_38 = CONCAT44((int)uVar3 + -2,(undefined4)uStack_38);
      segmentcheckReverse(ustring,closeSegment,(int *)((long)&uStack_38 + 4));
      uVar3 = (ulong)uStack_38._4_4_;
      if ((long)uVar3 < 0) {
        return 0xffffffffffffffff;
      }
      if (uVar3 < uVar1) {
        uVar1 = std::__cxx11::string::rfind
                          ((char *)ustring,(ulong)(keyword->_M_dataplus)._M_p,uVar3);
      }
    } while (uVar1 != 0xffffffffffffffff);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}